

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

bool lest::match(texts *whats,text *line)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  char *pcVar5;
  pointer pbVar6;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  pbVar6 = (whats->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (whats->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    bVar3 = pbVar6 != pbVar1;
    if (!bVar3) {
      return bVar3;
    }
    local_50 = local_40;
    pcVar2 = (pbVar6->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + pbVar6->_M_string_length);
    local_70 = local_60;
    pcVar2 = (line->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + line->_M_string_length);
    _Var4 = std::
            __search<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<lest::search(std::__cxx11::string,std::__cxx11::string)::_lambda(char,char)_1_>>
                      (local_70,local_70 + local_68,local_50,local_50 + local_48);
    pcVar5 = local_70 + local_68;
    if (local_70 != local_60) {
      operator_delete(local_70);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    if (_Var4._M_current != pcVar5) break;
    pbVar6 = pbVar6 + 1;
  }
  return bVar3;
}

Assistant:

env( std::ostream & out, options option )
    : os( out ), opt( option ), testing(), ctx() {}